

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::test_false(void)

{
  undefined1 local_1b3;
  undefined1 local_1b2 [2];
  view_type local_1b0;
  undefined1 local_19f;
  undefined1 local_19e [2];
  undefined4 local_19c;
  value local_198 [2];
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [6];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x65;
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x736c6166;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3d,"void basic_suite::test_false()",local_170,&local_174);
  local_18c[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_158);
  local_190 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3e,"void basic_suite::test_false()",local_18c,&local_190);
  local_198[0] = trial::protocol::json::basic_reader<char>::category
                           ((basic_reader<char> *)local_158);
  local_19c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x3f,"void basic_suite::test_false()",local_198,&local_19c);
  local_19e[0] = trial::protocol::json::basic_reader<char>::value<bool>
                           ((basic_reader<char> *)local_158);
  local_19f = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x40,"void basic_suite::test_false()",local_19e,&local_19f);
  local_1b0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("reader.literal()","\"false\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x41,"void basic_suite::test_false()",&local_1b0,"false");
  local_1b2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1b3 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x42,"void basic_suite::test_false()",local_1b2,&local_1b3);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void test_false()
{
    const char input[] = "false";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::false_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "false");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}